

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaWildcardPtr
xmlSchemaAddWildcard
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaTypeType type,xmlNodePtr node)

{
  xmlSchemaWildcardPtr item;
  
  if (schema == (xmlSchemaPtr)0x0 || ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    item = (xmlSchemaWildcardPtr)0x0;
  }
  else {
    item = (xmlSchemaWildcardPtr)(*xmlMalloc)(0x48);
    if (item == (xmlSchemaWildcardPtr)0x0) {
      item = (xmlSchemaWildcardPtr)0x0;
      xmlSchemaPErrMemory(ctxt,"adding wildcard",(xmlNodePtr)0x0);
    }
    else {
      *(undefined8 *)item = 0;
      item->id = (xmlChar *)0x0;
      item->annot = (xmlSchemaAnnotPtr)0x0;
      item->node = (xmlNodePtr)0x0;
      item->nsSet = (xmlSchemaWildcardNsPtr)0x0;
      item->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
      item->minOccurs = 0;
      item->maxOccurs = 0;
      item->processContents = 0;
      item->any = 0;
      *(undefined8 *)&item->flags = 0;
      item->type = type;
      item->node = node;
      xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,item);
    }
  }
  return item;
}

Assistant:

static xmlSchemaWildcardPtr
xmlSchemaAddWildcard(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
		     xmlSchemaTypeType type, xmlNodePtr node)
{
    xmlSchemaWildcardPtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaWildcardPtr) xmlMalloc(sizeof(xmlSchemaWildcard));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt, "adding wildcard", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaWildcard));
    ret->type = type;
    ret->node = node;
    WXS_ADD_LOCAL(ctxt, ret);
    return (ret);
}